

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall gl4cts::GPUShaderFP64Test4::verifyUniformValues(GPUShaderFP64Test4 *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  GLuint GVar4;
  _data *p_Var3;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  long lVar11;
  _stage_data **pp_Var12;
  long lVar13;
  int iVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  _stage_data *cs_stages [1];
  uint returned_uint_data [4];
  int returned_int_data [4];
  float returned_float_data [4];
  uniform_value_pair double_uniforms [5];
  uniform_value_pair dvec4_uniforms [5];
  uniform_value_pair dvec3_uniforms [5];
  uniform_value_pair dvec2_uniforms [5];
  double returned_double_data [4];
  _stage_data *noncs_stages [5];
  GLuint GStack_3d4;
  _stage_data *local_370;
  int aiStack_368 [4];
  int aiStack_358 [4];
  float afStack_348 [4];
  GLint local_338 [2];
  _data *local_330;
  GLint local_328;
  double *local_320;
  GLint local_318;
  double *local_310;
  GLint local_308;
  _stage_data *local_300;
  GLint local_2f8;
  _data *local_2f0;
  GLint local_2e8;
  double *local_2e0;
  GLint local_2d8;
  double *local_2d0;
  GLint local_2c8;
  double *local_2c0;
  GLint local_2b8;
  double *local_2b0;
  GLint local_2a8;
  double *local_2a0;
  GLint local_298;
  double *local_290;
  GLint local_288;
  double *local_280;
  GLint local_278;
  double *local_270;
  GLint local_268;
  double *local_260;
  GLint local_258;
  double *local_250;
  GLint local_248;
  double *local_240;
  GLint local_238;
  double *local_230;
  GLint local_228;
  double *local_220;
  GLint local_218;
  double *local_210;
  GLint local_208;
  double *local_200;
  double adStack_1f8 [4];
  undefined1 auStack_1d8 [120];
  ios_base aiStack_160 [264];
  _stage_data *local_58;
  _stage_data *local_50;
  _stage_data *local_48;
  _stage_data *local_40;
  _stage_data *local_38;
  long lVar10;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  local_370 = &this->m_data_cs;
  local_58 = &this->m_data_fs;
  local_50 = &this->m_data_gs;
  local_48 = &this->m_data_tc;
  local_40 = &this->m_data_te;
  local_38 = &this->m_data_vs;
  uVar2 = this->m_po_cs_id;
  GVar4 = this->m_po_noncs_id;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  bVar5 = true;
  while( true ) {
    pp_Var12 = &local_370;
    if (GVar4 != this->m_po_cs_id) {
      pp_Var12 = &local_58;
    }
    if (GVar4 != 0) break;
    bVar6 = !bVar5;
    bVar5 = false;
    GVar4 = uVar2;
    if (bVar6) {
      return true;
    }
  }
  local_300 = *pp_Var12;
  local_330 = &local_300->uniforms;
  local_338[0] = (local_300->uniforms).uniform_location_double;
  local_320 = (local_300->uniforms).uniform_double_arr;
  local_328 = (local_300->uniforms).uniform_location_double_arr[0];
  local_310 = (local_300->uniforms).uniform_double_arr + 1;
  local_318 = (local_300->uniforms).uniform_location_double_arr[1];
  local_308 = local_300->uniform_structure_arrays[0].uniform_location_double;
  local_2f0 = local_300->uniform_structure_arrays + 1;
  local_2f8 = local_300->uniform_structure_arrays[1].uniform_location_double;
  local_240 = (local_300->uniforms).uniform_dvec2;
  local_248 = (local_300->uniforms).uniform_location_dvec2;
  local_230 = (local_300->uniforms).uniform_dvec2_arr;
  local_238 = (local_300->uniforms).uniform_location_dvec2_arr[0];
  local_220 = (local_300->uniforms).uniform_dvec2_arr + 2;
  local_228 = (local_300->uniforms).uniform_location_dvec2_arr[1];
  local_210 = local_300->uniform_structure_arrays[0].uniform_dvec2;
  local_218 = local_300->uniform_structure_arrays[0].uniform_location_dvec2;
  local_200 = local_300->uniform_structure_arrays[1].uniform_dvec2;
  local_208 = local_300->uniform_structure_arrays[1].uniform_location_dvec2;
  local_290 = (local_300->uniforms).uniform_dvec3;
  local_298 = (local_300->uniforms).uniform_location_dvec3;
  local_280 = (local_300->uniforms).uniform_dvec3_arr;
  local_288 = (local_300->uniforms).uniform_location_dvec3_arr[0];
  local_270 = (local_300->uniforms).uniform_dvec3_arr + 3;
  local_278 = (local_300->uniforms).uniform_location_dvec3_arr[1];
  local_260 = local_300->uniform_structure_arrays[0].uniform_dvec3;
  local_268 = local_300->uniform_structure_arrays[0].uniform_location_dvec3;
  local_250 = local_300->uniform_structure_arrays[1].uniform_dvec3;
  local_258 = local_300->uniform_structure_arrays[1].uniform_location_dvec3;
  local_2e0 = (local_300->uniforms).uniform_dvec4;
  local_2e8 = (local_300->uniforms).uniform_location_dvec4;
  local_2d0 = (local_300->uniforms).uniform_dvec4_arr;
  local_2d8 = (local_300->uniforms).uniform_location_dvec4_arr[0];
  local_2c0 = (local_300->uniforms).uniform_dvec4_arr + 4;
  local_2c8 = (local_300->uniforms).uniform_location_dvec4_arr[1];
  local_2b0 = local_300->uniform_structure_arrays[0].uniform_dvec4;
  local_2b8 = local_300->uniform_structure_arrays[0].uniform_location_dvec4;
  local_2a8 = local_300->uniform_structure_arrays[1].uniform_location_dvec4;
  local_2a0 = local_300->uniform_structure_arrays[1].uniform_dvec4;
  lVar11 = 0;
  do {
    iVar8 = local_338[lVar11 * 4];
    p_Var3 = (&local_330)[lVar11 * 2];
    (**(code **)(lVar10 + 0xb58))(GVar4,iVar8,adStack_1f8);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGetUniformdv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1bbe);
    (**(code **)(lVar10 + 0xb60))(GVar4,iVar8,afStack_348);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGetUniformfv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1bc1);
    (**(code **)(lVar10 + 0xb68))(GVar4,iVar8,aiStack_358);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGetUniformiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1bc4);
    (**(code **)(lVar10 + 0xb70))(GVar4,iVar8,aiStack_368);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGetUniformuiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1bc7);
    lVar13 = 0;
    do {
      dVar18 = p_Var3->uniform_double_arr[lVar13 + -1];
      dVar16 = adStack_1f8[lVar13] - dVar18;
      dVar17 = -dVar16;
      if (-dVar16 <= dVar16) {
        dVar17 = dVar16;
      }
      if (9.999999747378752e-06 < dVar17) {
        auStack_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(auStack_1d8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid uniform value reported by glGetUniformdv() for uniform location [",0x49)
        ;
        std::ostream::operator<<(poVar1,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"] and component [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]: retrieved:[",0xe);
        std::ostream::_M_insert<double>(adStack_1f8[lVar13]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected:[",0xd);
        std::ostream::_M_insert<double>(p_Var3->uniform_double_arr[lVar13 + -1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)auStack_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(aiStack_160);
        dVar18 = p_Var3->uniform_double_arr[lVar13 + -1];
      }
      dVar16 = (double)afStack_348[lVar13] - dVar18;
      dVar17 = -dVar16;
      if (-dVar16 <= dVar16) {
        dVar17 = dVar16;
      }
      if (9.999999747378752e-06 < dVar17) {
        auStack_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(auStack_1d8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid uniform value reported by glGetUniformfv() for uniform location [",0x49)
        ;
        std::ostream::operator<<(poVar1,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"] and component [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]: retrieved:[",0xe);
        std::ostream::_M_insert<double>((double)afStack_348[lVar13]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected:[",0xd);
        std::ostream::_M_insert<double>(p_Var3->uniform_double_arr[lVar13 + -1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)auStack_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(aiStack_160);
        dVar18 = p_Var3->uniform_double_arr[lVar13 + -1];
      }
      fVar15 = floorf((float)dVar18 + 0.5);
      iVar14 = (int)(long)fVar15;
      if (dVar18 <= 0.0) {
        iVar14 = 0;
      }
      if (aiStack_358[lVar13] != (int)fVar15) {
        auStack_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(auStack_1d8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid uniform value reported by glGetUniformiv() for uniform location [",0x49)
        ;
        std::ostream::operator<<(poVar1,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"] and component [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]: retrieved:[",0xe);
        std::ostream::operator<<(poVar1,aiStack_358[lVar13]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected:[",0xd);
        std::ostream::operator<<(poVar1,(int)fVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)auStack_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(aiStack_160);
      }
      if (aiStack_368[lVar13] != iVar14) {
        auStack_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(auStack_1d8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid uniform value reported by glGetUniformuiv() for uniform location [",0x4a
                  );
        std::ostream::operator<<(poVar1,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"] and component [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]: retrieved:[",0xe);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected:[",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)auStack_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(aiStack_160);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 1);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  uVar7 = (*(code *)&UNK_0093365a)();
  return (bool)uVar7;
}

Assistant:

bool GPUShaderFP64Test4::verifyUniformValues()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Iterate through all programs */
	_stage_data*	   cs_stages[]	= { &m_data_cs };
	_stage_data*	   noncs_stages[] = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages	= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint programs[] = {
		m_po_noncs_id, m_po_cs_id,
	};
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	/* Set up rounding for the tests */
	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id		 = programs[n_program];
		unsigned int  n_stages   = 0;
		_stage_data** stage_data = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages   = n_cs_stages;
			stage_data = cs_stages;
		}
		else
		{
			n_stages   = n_noncs_stages;
			stage_data = noncs_stages;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr = stage_data[n_stage];

			/* Set up arrays that we will guide the automated testing */
			const uniform_value_pair double_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double, &stage_ptr->uniforms.uniform_double),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double_arr[0],
								   stage_ptr->uniforms.uniform_double_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double_arr[1],
								   stage_ptr->uniforms.uniform_double_arr + 1),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_double,
								   &stage_ptr->uniform_structure_arrays[0].uniform_double),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_double,
								   &stage_ptr->uniform_structure_arrays[1].uniform_double)
			};
			const uniform_value_pair dvec2_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2, stage_ptr->uniforms.uniform_dvec2),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2_arr[0],
								   stage_ptr->uniforms.uniform_dvec2_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2_arr[1],
								   stage_ptr->uniforms.uniform_dvec2_arr + 2),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec2,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec2),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec2,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec2)
			};
			const uniform_value_pair dvec3_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3, stage_ptr->uniforms.uniform_dvec3),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3_arr[0],
								   stage_ptr->uniforms.uniform_dvec3_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3_arr[1],
								   stage_ptr->uniforms.uniform_dvec3_arr + 3),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec3,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec3),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec3,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec3)
			};
			const uniform_value_pair dvec4_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4, stage_ptr->uniforms.uniform_dvec4),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4_arr[0],
								   stage_ptr->uniforms.uniform_dvec4_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4_arr[1],
								   stage_ptr->uniforms.uniform_dvec4_arr + 4),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec4,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec4),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec4,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec4)
			};

			/* Iterate over all uniforms and verify the values reported by the API */
			double		 returned_double_data[4];
			float		 returned_float_data[4];
			int			 returned_int_data[4];
			unsigned int returned_uint_data[4];

			for (unsigned int n_type = 0; n_type < 4 /* double/dvec2/dvec3/dvec4 */; ++n_type)
			{
				const uniform_value_pair* current_uv_pairs  = NULL;
				const unsigned int		  n_components_used = n_type + 1; /* n_type=0: double, n_type=1: dvec2, etc.. */
				unsigned int			  n_pairs			= 0;

				switch (n_type)
				{
				case 0: /* double */
				{
					current_uv_pairs = double_uniforms;
					n_pairs			 = sizeof(double_uniforms) / sizeof(double_uniforms[0]);

					break;
				}

				case 1: /* dvec2 */
				{
					current_uv_pairs = dvec2_uniforms;
					n_pairs			 = sizeof(dvec2_uniforms) / sizeof(dvec2_uniforms[0]);

					break;
				}

				case 2: /* dvec3 */
				{
					current_uv_pairs = dvec3_uniforms;
					n_pairs			 = sizeof(dvec3_uniforms) / sizeof(dvec3_uniforms[0]);

					break;
				}

				case 3: /* dvec4 */
				{
					current_uv_pairs = dvec4_uniforms;
					n_pairs			 = sizeof(dvec4_uniforms) / sizeof(dvec4_uniforms[0]);

					break;
				}

				default:
				{
					TCU_FAIL("Invalid type index requested");
				}
				} /* switch (n_type) */

				for (unsigned int n_pair = 0; n_pair < n_pairs; ++n_pair)
				{
					const uniform_value_pair& current_uv_pair  = current_uv_pairs[n_pair];
					glw::GLint				  uniform_location = current_uv_pair.first;
					const double*			  uniform_value	= current_uv_pair.second;

					/* Retrieve the values from the GL implementation*/
					gl.getUniformdv(po_id, uniform_location, returned_double_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformdv() call failed.");

					gl.getUniformfv(po_id, uniform_location, returned_float_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformfv() call failed.");

					gl.getUniformiv(po_id, uniform_location, returned_int_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformiv() call failed.");

					gl.getUniformuiv(po_id, uniform_location, returned_uint_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformuiv() call failed.");

					/* Make sure the values reported match the reference values */
					bool		can_continue = true;
					const float epsilon		 = 1e-5f;

					for (unsigned int n_component = 0; n_component < n_components_used && can_continue; ++n_component)
					{
						if (de::abs(returned_double_data[n_component] - uniform_value[n_component]) > epsilon)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformdv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_double_data[n_component] << "]"
																		", expected:["
								<< uniform_value[n_component] << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						if (de::abs(returned_float_data[n_component] - uniform_value[n_component]) > epsilon)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformfv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_float_data[n_component] << "]"
																	   ", expected:["
								<< uniform_value[n_component] << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						/* ints */
						int rounded_uniform_value_sint = (int)(deFloatRound((float)uniform_value[n_component]));
						unsigned int rounded_uniform_value_uint =
							(unsigned int)(uniform_value[n_component] > 0.0) ?
								((unsigned int)deFloatRound((float)uniform_value[n_component])) :
								0;

						if (returned_int_data[n_component] != rounded_uniform_value_sint)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformiv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_int_data[n_component] << "]"
																	 ", expected:["
								<< rounded_uniform_value_sint << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						if (returned_uint_data[n_component] != rounded_uniform_value_uint)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformuiv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_uint_data[n_component] << "]"
																	  ", expected:["
								<< rounded_uniform_value_uint << "]" << tcu::TestLog::EndMessage;

							result = false;
						}
					} /* for (all components) */
				}	 /* for (all uniform+value pairs) */
			}		  /* for (all 4 uniform types) */
		}			  /* for (all shader stages) */
	}				  /* for (both program objects) */

	/* All done! */
	return result;
}